

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestOneof_FooGroup * __thiscall
proto2_unittest::TestOneof::_internal_mutable_foogroup(TestOneof *this)

{
  FooCase FVar1;
  Arena *arena;
  TestAllTypes *pTVar2;
  TestOneof *this_local;
  
  FVar1 = foo_case(this);
  if (FVar1 != kFoogroup) {
    clear_foo(this);
    set_has_foogroup(this);
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pTVar2 = (TestAllTypes *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestOneof_FooGroup>(arena);
    (this->field_0)._impl_.foo_.foo_message_ = pTVar2;
  }
  return (TestOneof_FooGroup *)(this->field_0)._impl_.foo_.foo_message_;
}

Assistant:

inline ::proto2_unittest::TestOneof_FooGroup* PROTOBUF_NONNULL TestOneof::_internal_mutable_foogroup() {
  if (foo_case() != kFoogroup) {
    clear_foo();
    set_has_foogroup();
    _impl_.foo_.foogroup_ = 
        ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestOneof_FooGroup>(GetArena());
  }
  return _impl_.foo_.foogroup_;
}